

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          vector<int,_std::allocator<int>_> *p,float x,float y)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  work_t wVar6;
  long lVar7;
  long lVar8;
  reference pvVar9;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  float in_XMM1_Da;
  int j;
  float s3;
  float s2;
  float s1;
  float s0;
  store_t p3;
  store_t p2;
  store_t p1;
  store_t p0;
  long k;
  long i;
  store_t in_stack_ffffffffffffffaf;
  int in_stack_ffffffffffffffb0;
  int local_40;
  float local_18;
  float local_14;
  
  local_14 = in_XMM0_Da - 0.5;
  local_18 = in_XMM1_Da - 0.5;
  if (local_14 < 0.0) {
    local_14 = 0.0;
  }
  if (local_18 < 0.0) {
    local_18 = 0.0;
  }
  if ((float)(*(long *)(in_RDI + 2) + -1) <= local_14) {
    local_14 = (float)*(long *)(in_RDI + 2) - 1.001;
  }
  if ((float)(*(long *)(in_RDI + 4) + -1) <= local_18) {
    local_18 = (float)*(long *)(in_RDI + 4) - 1.001;
  }
  lVar7 = (long)local_14;
  lVar8 = (long)local_18;
  fVar10 = (local_14 - (float)lVar7) * 4.0;
  fVar11 = (local_18 - (float)lVar8) * 4.0;
  for (local_40 = 0; local_40 < *in_RDI; local_40 = local_40 + 1) {
    wVar6 = PixelTraits<unsigned_char>::invalid();
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_40);
    *pvVar9 = wVar6;
    bVar1 = *(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_40 * 8) + lVar8 * 8)
                     + lVar7);
    bVar2 = *(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_40 * 8) + lVar8 * 8)
                      + 1 + lVar7);
    bVar3 = *(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_40 * 8) + 8 +
                               lVar8 * 8) + lVar7);
    bVar4 = *(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_40 * 8) + 8 +
                               lVar8 * 8) + 1 + lVar7);
    bVar5 = isValidS((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                     CONCAT44(wVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf);
    if ((((bVar5) &&
         (bVar5 = isValidS((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                           CONCAT44(wVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
         bVar5)) &&
        (bVar5 = isValidS((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                          CONCAT44(wVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
        bVar5)) &&
       (bVar5 = isValidS((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(wVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf), bVar5
       )) {
      in_stack_ffffffffffffffb0 =
           (int)(((float)bVar4 * fVar10 * fVar11 +
                 (float)bVar3 * (4.0 - fVar10) * fVar11 +
                 (float)bVar1 * (4.0 - fVar10) * (4.0 - fVar11) +
                 (float)bVar2 * fVar10 * (4.0 - fVar11)) / 16.0);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_40);
      *pvVar9 = in_stack_ffffffffffffffb0;
    }
  }
  return;
}

Assistant:

void getBilinear(std::vector<work_t> &p, float x, float y) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      x*=4;
      y*=4;

      const float s0=(4-x)*(4-y);
      const float s1=x*(4-y);
      const float s2=(4-x)*y;
      const float s3=x*y;

      for (int j=0; j<depth; j++)
      {
        p[j]=ptraits::invalid();

        p0=img[j][k][i];
        p1=img[j][k][i+1];
        p2=img[j][k+1][i];
        p3=img[j][k+1][i+1];

        if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
        {
          p[j]=static_cast<work_t>((p0*s0+p1*s1+p2*s2+p3*s3)/16);
        }
      }
    }